

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O1

FT_Error raccess_guess_darwin_hfsplus
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  int iVar1;
  size_t __n;
  char *__dest;
  
  __n = strlen(base_file_name);
  iVar1 = 10;
  if ((long)__n < 0x7ffffffa) {
    if ((long)__n < -5) {
      __dest = (char *)0x0;
      iVar1 = 6;
      if (__n + 6 == 0) {
        iVar1 = 0;
      }
    }
    else {
      __dest = (char *)(*library->memory->alloc)(library->memory,__n + 6);
      iVar1 = (uint)(__dest == (char *)0x0) << 6;
    }
    if (iVar1 == 0) {
      memcpy(__dest,base_file_name,__n);
      builtin_strncpy(__dest + __n,"/rsrc",6);
      *result_file_name = __dest;
      *result_offset = 0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static FT_Error
  raccess_guess_darwin_hfsplus( FT_Library  library,
                                FT_Stream   stream,
                                char       *base_file_name,
                                char      **result_file_name,
                                FT_Long    *result_offset )
  {
    /*
      Only meaningful on systems with hfs+ drivers (or Macs).
     */
    FT_Error   error;
    char*      newpath = NULL;
    FT_Memory  memory;
    FT_Long    base_file_len = (FT_Long)ft_strlen( base_file_name );

    FT_UNUSED( stream );


    memory = library->memory;

    if ( base_file_len + 6 > FT_INT_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_QALLOC( newpath, base_file_len + 6 ) )
      return error;

    FT_MEM_COPY( newpath, base_file_name, base_file_len );
    FT_MEM_COPY( newpath + base_file_len, "/rsrc", 6 );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }